

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::ProtobufIdSanityCheck
               (StructDef *struct_def,ProtoIdGapAction gap_action,bool no_log)

{
  FILE *pFVar1;
  bool bVar2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields_00;
  undefined8 uVar3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  bool no_log_local;
  ProtoIdGapAction gap_action_local;
  StructDef *struct_def_local;
  
  fields_00 = &(struct_def->fields).vec;
  bVar2 = HasNonPositiveFieldId(fields_00);
  pFVar1 = _stderr;
  if (bVar2) {
    if (!no_log) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"Field id in struct %s has a non positive number value\n",uVar3);
    }
    struct_def_local._7_1_ = false;
  }
  else {
    bVar2 = HasTwiceUsedId(fields_00);
    pFVar1 = _stderr;
    if (bVar2) {
      if (!no_log) {
        uVar3 = std::__cxx11::string::c_str();
        fprintf(pFVar1,"Fields in struct %s have used an id twice\n",uVar3);
      }
      struct_def_local._7_1_ = false;
    }
    else {
      bVar2 = HasFieldIdFromReservedIds(fields_00,&struct_def->reserved_ids);
      pFVar1 = _stderr;
      if (bVar2) {
        if (!no_log) {
          uVar3 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"Fields in struct %s use id from reserved ids\n",uVar3);
        }
        struct_def_local._7_1_ = false;
      }
      else {
        if ((gap_action != NO_OP) && (bVar2 = HasGapInProtoId(fields_00), pFVar1 = _stderr, bVar2))
        {
          if (!no_log) {
            uVar3 = std::__cxx11::string::c_str();
            fprintf(pFVar1,"Fields in struct %s have gap between ids\n",uVar3);
          }
          if (gap_action == ERROR) {
            return false;
          }
        }
        struct_def_local._7_1_ = true;
      }
    }
  }
  return struct_def_local._7_1_;
}

Assistant:

static bool ProtobufIdSanityCheck(const StructDef &struct_def,
                                  IDLOptions::ProtoIdGapAction gap_action,
                                  bool no_log = false) {
  const auto &fields = struct_def.fields.vec;
  if (HasNonPositiveFieldId(fields)) {
    // TODO: Use LogCompilerWarn
    if (!no_log) {
      fprintf(stderr, "Field id in struct %s has a non positive number value\n",
              struct_def.name.c_str());
    }
    return false;
  }

  if (HasTwiceUsedId(fields)) {
    // TODO: Use LogCompilerWarn
    if (!no_log) {
      fprintf(stderr, "Fields in struct %s have used an id twice\n",
              struct_def.name.c_str());
    }
    return false;
  }

  if (HasFieldIdFromReservedIds(fields, struct_def.reserved_ids)) {
    // TODO: Use LogCompilerWarn
    if (!no_log) {
      fprintf(stderr, "Fields in struct %s use id from reserved ids\n",
              struct_def.name.c_str());
    }
    return false;
  }

  if (gap_action != IDLOptions::ProtoIdGapAction::NO_OP) {
    if (HasGapInProtoId(fields)) {
      // TODO: Use LogCompilerWarn
      if (!no_log) {
        fprintf(stderr, "Fields in struct %s have gap between ids\n",
                struct_def.name.c_str());
      }
      if (gap_action == IDLOptions::ProtoIdGapAction::ERROR) { return false; }
    }
  }

  return true;
}